

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

string * __thiscall
pstack::Context::linkResolve(string *__return_storage_ptr__,Context *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  ssize_t sVar6;
  int *piVar7;
  size_t sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  string *psVar10;
  ulong uVar11;
  undefined8 uVar12;
  size_type sVar13;
  char local_4b8 [8];
  char buf [1024];
  undefined1 local_b0 [8];
  string orig;
  size_type local_88;
  ulong local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0 = (undefined1  [8])&orig._M_string_length;
  pcVar3 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar3,pcVar3 + name->_M_string_length);
  sVar6 = readlink((name->_M_dataplus)._M_p,local_4b8,0x3ff);
  if ((int)sVar6 != -1) {
    paVar1 = &local_50.field_2;
    buf._1016_8_ = __return_storage_ptr__;
    do {
      local_4b8[(int)sVar6] = '\0';
      sVar13 = name->_M_string_length;
      if (local_4b8[0] == '/') {
        sVar8 = strlen(local_4b8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (name,0,sVar13,local_4b8,sVar8);
      }
      else {
        if (sVar13 == 0) {
LAB_00155cd0:
          local_50._M_dataplus._M_p = (pointer)paVar1;
          sVar8 = strlen(local_4b8);
          bVar4 = true;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,local_4b8,local_4b8 + sVar8);
        }
        else {
          sVar13 = sVar13 + 1;
          do {
            if (sVar13 == 1) goto LAB_00155cd0;
            __n = sVar13 - 1;
            lVar5 = sVar13 - 2;
            sVar13 = __n;
          } while ((name->_M_dataplus)._M_p[lVar5] != '/');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&orig.field_2 + 8),name,0,__n);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          sVar8 = strlen(local_4b8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,local_4b8,local_4b8 + sVar8);
          uVar11 = 0xf;
          if ((ulong *)orig.field_2._8_8_ != &stack0xffffffffffffff80) {
            uVar11 = local_80;
          }
          if (uVar11 < local_70._M_string_length + local_88) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              uVar12 = local_70.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_70._M_string_length + local_88) goto LAB_00155d9d;
            pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::replace(&local_70,0,0,(char *)orig.field_2._8_8_,local_88);
          }
          else {
LAB_00155d9d:
            pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&orig.field_2 + 8),local_70._M_dataplus._M_p,
                                 local_70._M_string_length);
          }
          local_50._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
          paVar2 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == paVar2) {
            local_50.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
            local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_50._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_50.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
          }
          local_50._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar2;
          pbVar9->_M_string_length = 0;
          paVar2->_M_local_buf[0] = '\0';
          bVar4 = false;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (name,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        __return_storage_ptr__ = (string *)buf._1016_8_;
        if (!bVar4) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((ulong *)orig.field_2._8_8_ != &stack0xffffffffffffff80) {
            operator_delete((void *)orig.field_2._8_8_,local_80 + 1);
          }
        }
      }
      sVar6 = readlink((name->_M_dataplus)._M_p,local_4b8,0x3ff);
    } while ((int)sVar6 != -1);
  }
  piVar7 = __errno_location();
  psVar10 = (string *)local_b0;
  if (*piVar7 == 0x16) {
    psVar10 = name;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar10->_M_string_length);
  if (local_b0 != (undefined1  [8])&orig._M_string_length) {
    operator_delete((void *)local_b0,orig._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Context::linkResolve(std::string name)
{
    char buf[1024];
    std::string orig = name;
    int rc;
    for (;;) {
        rc = readlink(name.c_str(), buf, sizeof buf - 1);
        // some files in /proc are links, but report "(deleted)" in the name if
        // the original has gone away. Opening such files works, and uses the
        // in-core inode, so use that if we can
        if (rc == -1) {
            return errno == EINVAL ? name : orig;
        }
        buf[rc] = 0;
        if (buf[0] != '/') {
            auto lastSlash = name.rfind('/');
            name = lastSlash == std::string::npos
               ? std::string(buf)
               : name.substr(0, lastSlash + 1) + std::string(buf);
        } else {
            name = buf;
        }
    }
    return name;
}